

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

UniquePtr<struct_stack_st_X509_NAME> DecodeHexX509Names(string *hex_names)

{
  UniquePtr<X509_NAME> UVar1;
  bool bVar2;
  enable_if_t<_internal::StackTraits<stack_st_X509_NAME>::kIsConst,_bool> eVar3;
  stack_st_X509_NAME *__p;
  __uniq_ptr_data<X509_name_st,_bssl::internal::Deleter,_true,_true> _Var4;
  long lVar5;
  pointer __p_00;
  pointer sk;
  string *in_RSI;
  unique_ptr<X509_name_st,_bssl::internal::Deleter> local_88;
  unique_ptr<X509_name_st,_bssl::internal::Deleter> local_80;
  UniquePtr<X509_NAME> name;
  uint8_t *derp;
  uint8_t *data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *der_name;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter> local_38;
  UniquePtr<struct_stack_st_X509_NAME> ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  der_names;
  string *hex_names_local;
  
  DecodeHexStrings((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&ret,in_RSI);
  __p = sk_X509_NAME_new_null();
  std::unique_ptr<stack_st_X509_NAME,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<stack_st_X509_NAME,bssl::internal::Deleter> *)&local_38,__p);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_38);
  if (bVar2) {
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&ret);
    der_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&ret);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&der_name), bVar2) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&__end1);
      _Var4.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
           (__uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>)std::__cxx11::string::data();
      name._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<X509_name_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<X509_name_st,_bssl::internal::Deleter,_true,_true>)
           _Var4.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl;
      lVar5 = std::__cxx11::string::size();
      __p_00 = (pointer)d2i_X509_NAME((X509_NAME **)0x0,(uchar **)&name,lVar5);
      std::unique_ptr<X509_name_st,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<X509_name_st,bssl::internal::Deleter> *)&local_80,__p_00);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_80);
      UVar1 = name;
      if ((bVar2) &&
         (lVar5 = std::__cxx11::string::size(),
         UVar1._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl ==
         (__uniq_ptr_data<X509_name_st,_bssl::internal::Deleter,_true,_true>)
         ((long)_Var4.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl + lVar5))) {
        sk = std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::get(&local_38);
        std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::unique_ptr(&local_88,&local_80);
        eVar3 = bssl::PushToStack<stack_st_X509_NAME>(sk,&local_88);
        std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr(&local_88);
        if (((eVar3 ^ 0xffU) & 1) == 0) {
          bVar2 = false;
        }
        else {
          std::unique_ptr<stack_st_X509_NAME,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<stack_st_X509_NAME,bssl::internal::Deleter> *)hex_names,
                     (nullptr_t)0x0);
          bVar2 = true;
        }
      }
      else {
        fprintf(_stderr,"Failed to parse X509_NAME.\n");
        std::unique_ptr<stack_st_X509_NAME,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<stack_st_X509_NAME,bssl::internal::Deleter> *)hex_names,
                   (nullptr_t)0x0);
        bVar2 = true;
      }
      std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr(&local_80);
      if (bVar2) goto LAB_0013ad5c;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::unique_ptr
              ((unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter> *)hex_names,&local_38);
  }
  else {
    std::unique_ptr<stack_st_X509_NAME,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<stack_st_X509_NAME,bssl::internal::Deleter> *)hex_names,(nullptr_t)0x0);
  }
LAB_0013ad5c:
  std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&ret);
  return (__uniq_ptr_data<stack_st_X509_NAME,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<stack_st_X509_NAME,_bssl::internal::Deleter,_true,_true>)hex_names;
}

Assistant:

static bssl::UniquePtr<STACK_OF(X509_NAME)> DecodeHexX509Names(
    const std::string &hex_names) {
  const std::vector<std::string> der_names = DecodeHexStrings(hex_names);
  bssl::UniquePtr<STACK_OF(X509_NAME)> ret(sk_X509_NAME_new_null());
  if (!ret) {
    return nullptr;
  }

  for (const auto &der_name : der_names) {
    const uint8_t *const data =
        reinterpret_cast<const uint8_t *>(der_name.data());
    const uint8_t *derp = data;
    bssl::UniquePtr<X509_NAME> name(
        d2i_X509_NAME(nullptr, &derp, der_name.size()));
    if (!name || derp != data + der_name.size()) {
      fprintf(stderr, "Failed to parse X509_NAME.\n");
      return nullptr;
    }

    if (!bssl::PushToStack(ret.get(), std::move(name))) {
      return nullptr;
    }
  }

  return ret;
}